

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::anon_unknown_14::TileProcess::run_decode
          (TileProcess *this,exr_const_context_t ctxt,int pn,DeepFrameBuffer *outfb,
          vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *filllist)

{
  exr_decode_pipeline_t *peVar1;
  uint16_t *puVar2;
  int32_t *__src;
  undefined8 *puVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  PixelType PVar7;
  exr_coding_channel_info_t *peVar8;
  size_t sVar9;
  pointer pDVar10;
  long lVar11;
  int iVar12;
  DeepSlice *pDVar13;
  Slice *pSVar14;
  size_t sVar15;
  ArgExc *this_00;
  ostream *poVar16;
  char *pcVar17;
  IoExc *this_01;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int32_t *piVar21;
  ulong uVar22;
  code *pcVar23;
  long lVar24;
  long lVar25;
  undefined *puVar26;
  uint16_t uVar27;
  long *plVar28;
  long *plVar29;
  int y;
  int iVar30;
  long lVar31;
  ulong uVar32;
  int32_t *piVar33;
  pointer pDVar34;
  int tileY;
  int tileX;
  vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *local_1d0;
  exr_attr_box2i_t dw;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  peVar1 = &this->decoder;
  if (this->first == true) {
    iVar12 = exr_decoding_initialize(ctxt,pn,&this->cinfo,peVar1);
    if (iVar12 == 0) {
      puVar2 = &(this->decoder).decode_flags;
      *(byte *)puVar2 = (byte)*puVar2 | 3;
      this->first = false;
      uVar27 = 0;
LAB_00171302:
      iVar12 = exr_get_data_window(ctxt,pn,&dw);
      if (iVar12 == 0) {
        local_1d0 = filllist;
        iVar12 = exr_get_tile_sizes(ctxt,pn,(this->cinfo).level_x,(this->cinfo).level_y,&tileX,
                                    &tileY);
        if (iVar12 == 0) {
          uVar19 = (long)(this->cinfo).start_x * (long)tileX + (long)dw.min.x;
          uVar20 = (long)(this->cinfo).start_y * (long)tileY + (long)dw.min.y;
          (this->decoder).decode_flags =
               ((this->decoder).decode_flags & 0xfffb) + (ushort)this->counts_only * 4;
          (this->decoder).user_line_begin_skip = 0;
          (this->decoder).user_line_end_ignore = 0;
          lVar24 = 0x28;
          for (lVar25 = 0; lVar25 < (this->decoder).channel_count; lVar25 = lVar25 + 1) {
            peVar8 = (this->decoder).channels;
            pDVar13 = DeepFrameBuffer::findSlice(outfb,*(char **)((long)peVar8 + lVar24 + -0x28));
            if ((pDVar13 == (DeepSlice *)0x0) || (*(int *)((long)peVar8 + lVar24 + -0x20) == 0)) {
              puVar3 = (undefined8 *)((long)peVar8 + lVar24 + -8);
              *puVar3 = 0;
              puVar3[1] = 0;
            }
            else {
              if (((pDVar13->super_Slice).xSampling != 1) || ((pDVar13->super_Slice).ySampling != 1)
                 ) {
                this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                goto LAB_001716e6;
              }
              uVar18 = uVar19;
              if ((pDVar13->super_Slice).xTileCoords != false) {
                uVar18 = 0;
              }
              bVar5 = (pDVar13->super_Slice).yTileCoords;
              *(undefined2 *)((long)peVar8 + lVar24 + -0xc) =
                   *(undefined2 *)&(pDVar13->super_Slice).field_0x34;
              *(short *)((long)peVar8 + lVar24 + -10) = (short)(pDVar13->super_Slice).type;
              sVar15 = (pDVar13->super_Slice).xStride;
              *(int *)((long)peVar8 + lVar24 + -8) = (int)sVar15;
              sVar9 = (pDVar13->super_Slice).yStride;
              uVar22 = uVar20;
              if (bVar5 != false) {
                uVar22 = 0;
              }
              *(int *)((long)peVar8 + lVar24 + -4) = (int)sVar9;
              *(char **)((long)&peVar8->channel_name + lVar24) =
                   (pDVar13->super_Slice).base + uVar22 * sVar9 + uVar18 * sVar15;
            }
            lVar24 = lVar24 + 0x30;
          }
          if (uVar27 != (this->decoder).decode_flags) {
            iVar12 = exr_decoding_choose_default_routines(ctxt,pn,peVar1);
            if (iVar12 != 0) {
              this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to choose decoder routines");
              goto LAB_00171847;
            }
          }
          iVar12 = exr_decoding_run(ctxt,pn,peVar1);
          this->last_decode_err = iVar12;
          if (iVar12 != 0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            poVar16 = std::operator<<(local_1a8,"Unable to run decoder: ");
            pcVar17 = (char *)exr_get_error_code_as_string(this->last_decode_err);
            std::operator<<(poVar16,pcVar17);
            this_01 = (IoExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc(this_01,(stringstream *)&_iex_throw_s);
            __cxa_throw(this_01,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
          }
          pSVar14 = DeepFrameBuffer::getSampleCountSlice(outfb);
          if ((pSVar14->xSampling == 1) && (pSVar14->ySampling == 1)) {
            uVar22 = 0;
            uVar18 = uVar19;
            if (pSVar14->xTileCoords != false) {
              uVar18 = uVar22;
            }
            sVar15 = pSVar14->xStride;
            sVar9 = pSVar14->yStride;
            uVar32 = uVar20;
            if (pSVar14->yTileCoords != false) {
              uVar32 = uVar22;
            }
            piVar33 = (int32_t *)(pSVar14->base + uVar32 * sVar9 + uVar18 * sVar15);
            while( true ) {
              iVar12 = (this->cinfo).height;
              iVar30 = (int)uVar22;
              if (iVar12 <= iVar30) break;
              iVar12 = (this->cinfo).width;
              __src = (this->decoder).sample_count_table + iVar12 * iVar30;
              if (sVar15 == 4) {
                memcpy(piVar33,__src,(long)iVar12 << 2);
              }
              else {
                piVar21 = piVar33;
                for (lVar24 = 0; lVar24 < iVar12; lVar24 = lVar24 + 1) {
                  *piVar21 = __src[lVar24];
                  piVar21 = (int32_t *)((long)piVar21 + sVar15);
                  iVar12 = (this->cinfo).width;
                }
              }
              piVar33 = (int32_t *)((long)piVar33 + sVar9);
              uVar22 = (ulong)(iVar30 + 1);
            }
            if (this->counts_only == false) {
              pDVar10 = (local_1d0->
                        super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>)
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pDVar34 = (local_1d0->
                             super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>
                             )._M_impl.super__Vector_impl_data._M_start; pDVar34 != pDVar10;
                  pDVar34 = pDVar34 + 1) {
                if (((pDVar34->super_Slice).xSampling != 1) ||
                   ((pDVar34->super_Slice).ySampling != 1)) {
                  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                  goto LAB_001716e6;
                }
                uVar18 = uVar19;
                if ((pDVar34->super_Slice).xTileCoords != false) {
                  uVar18 = 0;
                }
                sVar15 = (pDVar34->super_Slice).xStride;
                uVar22 = uVar20;
                if ((pDVar34->super_Slice).yTileCoords != false) {
                  uVar22 = 0;
                }
                plVar28 = (long *)((pDVar34->super_Slice).base +
                                  uVar22 * (pDVar34->super_Slice).yStride + uVar18 * sVar15);
                for (lVar24 = 0; lVar24 < iVar12; lVar24 = lVar24 + 1) {
                  uVar18 = (ulong)(this->cinfo).width;
                  lVar31 = uVar18 * lVar24;
                  piVar33 = (this->decoder).sample_count_table;
                  plVar29 = plVar28;
                  for (lVar25 = 0; lVar25 < (int)uVar18; lVar25 = lVar25 + 1) {
                    uVar6 = piVar33[lVar31 + lVar25];
                    if ((uVar6 != 0) && (lVar11 = *plVar29, lVar11 != 0)) {
                      PVar7 = (pDVar34->super_Slice).type;
                      if (PVar7 == FLOAT) {
                        dVar4 = (pDVar34->super_Slice).fillValue;
                        uVar18 = (ulong)uVar6;
                        if ((int)uVar6 < 1) {
                          uVar18 = 0;
                        }
                        for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
                          *(float *)(lVar11 + uVar22 * 4) = (float)dVar4;
                        }
                      }
                      else if (PVar7 == HALF) {
                        Imath_3_2::half::half
                                  ((half *)&_iex_throw_s,(float)(pDVar34->super_Slice).fillValue);
                        uVar18 = (ulong)uVar6;
                        if ((int)uVar6 < 1) {
                          uVar18 = 0;
                        }
                        for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
                          *(undefined2 *)(lVar11 + uVar22 * 2) = __iex_throw_s;
                        }
                        sVar15 = (pDVar34->super_Slice).xStride;
                      }
                      else {
                        if (PVar7 != UINT) {
                          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                          Iex_3_4::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
                          goto LAB_001716e6;
                        }
                        dVar4 = (pDVar34->super_Slice).fillValue;
                        uVar18 = (ulong)uVar6;
                        if ((int)uVar6 < 1) {
                          uVar18 = 0;
                        }
                        for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
                          *(int *)(lVar11 + uVar22 * 4) = (int)(long)dVar4;
                        }
                      }
                    }
                    plVar29 = (long *)((long)plVar29 + sVar15);
                    uVar18 = (ulong)(uint)(this->cinfo).width;
                  }
                  plVar28 = (long *)((long)plVar28 + (pDVar34->super_Slice).yStride);
                  iVar12 = (this->cinfo).height;
                }
              }
            }
            return;
          }
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
        }
        else {
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
        }
      }
      else {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
      }
LAB_001716e6:
      puVar26 = &Iex_3_4::ArgExc::typeinfo;
      pcVar23 = Iex_3_4::ArgExc::~ArgExc;
      goto LAB_001716f4;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to initialize decode pipeline");
  }
  else {
    iVar12 = exr_decoding_update(ctxt,pn,&this->cinfo,peVar1);
    if (iVar12 == 0) {
      uVar27 = (uint16_t)(byte)(this->decoder).decode_flags;
      goto LAB_00171302;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to update decode pipeline");
  }
LAB_00171847:
  puVar26 = &Iex_3_4::IoExc::typeinfo;
  pcVar23 = Iex_3_4::IoExc::~IoExc;
LAB_001716f4:
  __cxa_throw(this_00,puVar26,pcVar23);
}

Assistant:

void TileProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const DeepFrameBuffer *outfb,
    const std::vector<DeepSlice> &filllist)
{
    int absX, absY, tileX, tileY;
    exr_attr_box2i_t dw;
    uint8_t flags;

    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }
        decoder.decode_flags |= EXR_DECODE_NON_IMAGE_DATA_AS_POINTERS;
        decoder.decode_flags |= EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL;
        flags = 0;

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
        flags = decoder.decode_flags;
    }

    if (EXR_ERR_SUCCESS != exr_get_data_window (ctxt, pn, &dw))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    if (EXR_ERR_SUCCESS != exr_get_tile_sizes (
            ctxt, pn, cinfo.level_x, cinfo.level_y, &tileX, &tileY))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    absX = dw.min.x + tileX * cinfo.start_x;
    absY = dw.min.y + tileY * cinfo.start_y;

    if (counts_only)
        decoder.decode_flags |= EXR_DECODE_SAMPLE_DATA_ONLY;
    else
        decoder.decode_flags = decoder.decode_flags & ~EXR_DECODE_SAMPLE_DATA_ONLY;

    update_pointers (outfb, dw.min.x, dw.min.y, absX, absY);

    if (flags != decoder.decode_flags)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
    {
        THROW (
            IEX_NAMESPACE::IoExc,
            "Unable to run decoder: "
            << exr_get_error_code_as_string (last_decode_err));
    }

    copy_sample_count (outfb, dw.min.x, dw.min.y, absX, absY);

    if (counts_only)
        return;

    run_fill (outfb, dw.min.x, dw.min.y, absX, absY, filllist);
}